

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O2

FT_Bool sfnt_get_name_id(TT_Face face,FT_UShort id,FT_Int *win,FT_Int *apple)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  TT_NameRec *pTVar4;
  long lVar5;
  ulong uVar6;
  FT_Int *pFVar7;
  
  *win = -1;
  *apple = -1;
  uVar1 = face->num_names;
  lVar5 = 8;
  uVar6 = 0;
  do {
    if (uVar1 <= uVar6) {
      if (-1 < *win) {
        return '\x01';
      }
      return -1 < *apple;
    }
    pTVar4 = (face->name_table).names;
    if ((*(FT_UShort *)((long)pTVar4 + lVar5 + -2) == id) &&
       (*(short *)((long)&pTVar4->platformID + lVar5) != 0)) {
      sVar2 = *(short *)((long)pTVar4 + lVar5 + -8);
      if (sVar2 == 1) {
        if (*(short *)((long)pTVar4 + lVar5 + -6) == 0) {
          pFVar7 = apple;
          if (*(short *)((long)pTVar4 + lVar5 + -4) != 0) {
            iVar3 = *apple;
            goto joined_r0x0020a4ea;
          }
          goto LAB_0020a4ec;
        }
      }
      else if ((sVar2 == 3) && (*(ushort *)((long)pTVar4 + lVar5 + -6) < 2)) {
        pFVar7 = win;
        if (*(short *)((long)pTVar4 + lVar5 + -4) != 0x409) {
          iVar3 = *win;
joined_r0x0020a4ea:
          if (iVar3 != -1) goto LAB_0020a4ef;
        }
LAB_0020a4ec:
        *pFVar7 = (FT_Int)uVar6;
      }
    }
LAB_0020a4ef:
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x20;
  } while( true );
}

Assistant:

static FT_Bool
  sfnt_get_name_id( TT_Face    face,
                    FT_UShort  id,
                    FT_Int    *win,
                    FT_Int    *apple )
  {
    FT_Int  n;


    *win   = -1;
    *apple = -1;

    for ( n = 0; n < face->num_names; n++ )
    {
      TT_Name  name = face->name_table.names + n;


      if ( name->nameID == id && name->stringLength > 0 )
      {
        if ( IS_WIN( name ) && ( name->languageID == 0x409 || *win == -1 ) )
          *win = n;

        if ( IS_APPLE( name ) && ( name->languageID == 0 || *apple == -1 ) )
          *apple = n;
      }
    }

    return ( *win >= 0 ) || ( *apple >= 0 );
  }